

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommands.cpp
# Opt level: O3

void __thiscall
DataCommands::DataCommands
          (DataCommands *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *separated)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
  *puVar1;
  pthread_mutex_t *mutex;
  DataVars *this_00;
  DataBinds *this_01;
  OpenDataServerCommand *this_02;
  ConnectCommand *this_03;
  VarCommand *this_04;
  BindCommand *this_05;
  WhileCommand *this_06;
  IfCommand *this_07;
  PrintCommand *this_08;
  EqualCommand *this_09;
  EntercCommand *this_10;
  SleepCommand *this_11;
  long *local_58 [2];
  long local_48 [2];
  OpenDataServerCommand *local_38;
  
  (this->separated).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->index = 0;
  (this->separated).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->separated).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = &this->stringsToCommands;
  (this->stringsToCommands)._M_h._M_buckets = &(this->stringsToCommands)._M_h._M_single_bucket;
  (this->stringsToCommands)._M_h._M_bucket_count = 1;
  (this->stringsToCommands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->stringsToCommands)._M_h._M_element_count = 0;
  (this->stringsToCommands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stringsToCommands)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->stringsToCommands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->separated,separated);
  this_00 = (DataVars *)operator_new(0x58);
  DataVars::DataVars(this_00);
  this_01 = (DataBinds *)operator_new(0x38);
  DataBinds::DataBinds(this_01);
  mutex = &this->mutex;
  pthread_mutex_init((pthread_mutex_t *)mutex,(pthread_mutexattr_t *)0x0);
  this_02 = (OpenDataServerCommand *)operator_new(0x78);
  OpenDataServerCommand::OpenDataServerCommand(this_02,this,this_01,this_00,mutex);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"openDataServer","");
  local_38 = this_02;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  this_03 = (ConnectCommand *)operator_new(0x78);
  ConnectCommand::ConnectCommand(this_03,this,this_01,this_00,mutex);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"connect","");
  local_38 = (OpenDataServerCommand *)this_03;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  this_04 = (VarCommand *)operator_new(0x18);
  VarCommand::VarCommand(this_04,this,this_00);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"var","");
  local_38 = (OpenDataServerCommand *)this_04;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  this_05 = (BindCommand *)operator_new(0x18);
  BindCommand::BindCommand(this_05,this,this_01);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"bind","");
  local_38 = (OpenDataServerCommand *)this_05;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  this_06 = (WhileCommand *)operator_new(0x30);
  WhileCommand::WhileCommand(this_06,this,this_00);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"while","");
  local_38 = (OpenDataServerCommand *)this_06;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  this_07 = (IfCommand *)operator_new(0x30);
  IfCommand::IfCommand(this_07,this,this_00);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"if","");
  local_38 = (OpenDataServerCommand *)this_07;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  this_08 = (PrintCommand *)operator_new(0x18);
  PrintCommand::PrintCommand(this_08,this,this_00);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"print","");
  local_38 = (OpenDataServerCommand *)this_08;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  this_09 = (EqualCommand *)operator_new(0x18);
  EqualCommand::EqualCommand(this_09,this,this_00);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"=","");
  local_38 = (OpenDataServerCommand *)this_09;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  this_10 = (EntercCommand *)operator_new(0x10);
  EntercCommand::EntercCommand(this_10,this);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"enterc","");
  local_38 = (OpenDataServerCommand *)this_10;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  this_11 = (SleepCommand *)operator_new(0x18);
  SleepCommand::SleepCommand(this_11,this,this_00);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"sleep","");
  local_38 = (OpenDataServerCommand *)this_11;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

DataCommands::DataCommands(vector<string> &separated) {
    this->index = 0;
    this->separated = separated;

    DataVars *dataVars;
    dataVars = new DataVars();

    DataBinds *dataBinds;
    dataBinds = new DataBinds();

    pthread_mutex_init(&this->mutex, nullptr);

    this->stringsToCommands.insert(
            pair<string, Command *>("openDataServer", new OpenDataServerCommand(this, dataBinds, dataVars, mutex)));
    this->stringsToCommands.insert(
            pair<string, Command *>("connect", new ConnectCommand(this, dataBinds, dataVars, mutex)));
    this->stringsToCommands.insert(pair<string, Command *>("var", new VarCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("bind", new BindCommand(this, dataBinds)));
    this->stringsToCommands.insert(pair<string, Command *>("while", new WhileCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("if", new IfCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("print", new PrintCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("=", new EqualCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("enterc", new EntercCommand(this)));
    this->stringsToCommands.insert(pair<string, Command *>("sleep", new SleepCommand(this, dataVars)));
}